

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

bool absl::lts_20250127::container_internal::operator==(iterator *a,iterator *b)

{
  iterator *piVar1;
  iterator *piVar2;
  iterator *piVar3;
  ctrl_t *pcVar4;
  iterator *piVar5;
  iterator *piVar6;
  undefined1 extraout_AL;
  bool bVar7;
  iterator *piVar8;
  
  piVar1 = (iterator *)a->ctrl_;
  if ((piVar1 == (iterator *)(kEmptyGroup + 0x10) || piVar1 == (iterator *)0x0) ||
     (-1 < (char)*(byte *)&piVar1->ctrl_)) {
    piVar2 = (iterator *)b->ctrl_;
    if ((piVar2 != (iterator *)(kEmptyGroup + 0x10) && piVar2 != (iterator *)0x0) &&
       ((char)*(byte *)&piVar2->ctrl_ < '\0')) goto LAB_0022a312;
    if (piVar1 == (iterator *)(kEmptyGroup + 0x10) && piVar2 == (iterator *)(kEmptyGroup + 0x10)) {
LAB_0022a305:
      return piVar1 == piVar2;
    }
    if ((piVar1 == (iterator *)(kEmptyGroup + 0x10)) != (piVar2 == (iterator *)(kEmptyGroup + 0x10))
       ) goto LAB_0022a317;
    if (piVar1 == (iterator *)0x0 || piVar2 == (iterator *)0x0) goto LAB_0022a305;
    if ((piVar2 == (iterator *)kSooControl) == (piVar1 == (iterator *)kSooControl)) {
      a = (iterator *)(a->field_1).slot_;
      piVar3 = (iterator *)(b->field_1).slot_;
      if (piVar1 == (iterator *)kSooControl) {
        bVar7 = a == piVar3;
      }
      else {
        piVar8 = piVar3;
        piVar5 = piVar2;
        piVar6 = a;
        if (piVar2 < piVar1) {
          piVar8 = a;
          piVar5 = piVar1;
          piVar6 = piVar3;
        }
        bVar7 = piVar6 <= piVar8 && piVar5 < piVar6;
      }
      if (bVar7) goto LAB_0022a305;
    }
  }
  else {
    operator==();
LAB_0022a312:
    operator==();
LAB_0022a317:
    operator==();
  }
  operator==();
  pcVar4 = a->ctrl_;
  if (pcVar4 == (ctrl_t *)0x0) {
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,std::allocator<google::protobuf::Symbol>>
    ::iterator::operator*((iterator *)a);
  }
  else if (pcVar4 != kEmptyGroup + 0x10) {
    if (kSentinel < *pcVar4) {
      return SUB81(a->field_1,0);
    }
    goto LAB_0022a350;
  }
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,std::allocator<google::protobuf::Symbol>>
  ::iterator::operator*((iterator *)a);
LAB_0022a350:
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,std::allocator<google::protobuf::Symbol>>
  ::iterator::operator*((iterator *)a);
  if (a->ctrl_ == (ctrl_t *)0x1) {
    __assert_fail("(!is_soo()) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x100d,
                  "void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::FileDescriptor *>, google::protobuf::(anonymous namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>, google::protobuf::(anonymous namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>, std::allocator<const google::protobuf::FileDescriptor *>>::prefetch_heap_block() const [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::FileDescriptor *>, Hash = google::protobuf::(anonymous namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>, Eq = google::protobuf::(anonymous namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>, Alloc = std::allocator<const google::protobuf::FileDescriptor *>]"
                 );
  }
  if (a->ctrl_ == (ctrl_t *)0x0) {
    __assert_fail("cap >= kDefaultCapacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xb75,
                  "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::FileDescriptor *>, google::protobuf::(anonymous namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>, google::protobuf::(anonymous namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>, std::allocator<const google::protobuf::FileDescriptor *>>::capacity() const [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::FileDescriptor *>, Hash = google::protobuf::(anonymous namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>, Eq = google::protobuf::(anonymous namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>, Alloc = std::allocator<const google::protobuf::FileDescriptor *>]"
                 );
  }
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ::control((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
             *)a);
  return (bool)extraout_AL;
}

Assistant:

bool operator==(const iterator& a, const iterator& b) {
      AssertIsValidForComparison(a.ctrl_, a.generation(), a.generation_ptr());
      AssertIsValidForComparison(b.ctrl_, b.generation(), b.generation_ptr());
      AssertSameContainer(a.ctrl_, b.ctrl_, a.slot_, b.slot_,
                          a.generation_ptr(), b.generation_ptr());
      return a.ctrl_ == b.ctrl_;
    }